

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_rsa_decode_md_type(psa_algorithm_t alg,size_t hash_length,mbedtls_md_type_t *md_alg)

{
  byte bVar1;
  mbedtls_md_type_t mVar2;
  mbedtls_md_info_t *md_info_00;
  psa_algorithm_t local_38;
  uint local_34;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t hash_alg;
  mbedtls_md_type_t *md_alg_local;
  size_t hash_length_local;
  psa_algorithm_t alg_local;
  
  if (((((alg & 0xffffff00) == 0x10030000) || ((alg & 0xffffff00) == 0x10020000)) ||
      ((alg & 0xfffeff00) == 0x10040000)) || ((alg & 0xfffeff00) == 0x10060000)) {
    if ((alg & 0xff) == 0) {
      local_34 = 0;
    }
    else {
      local_34 = alg & 0xff | 0x1000000;
    }
    local_38 = local_34;
  }
  else {
    local_38 = 0;
  }
  md_info_00 = mbedtls_md_info_from_psa(local_38);
  mVar2 = mbedtls_md_get_type(md_info_00);
  *md_alg = mVar2;
  if (0xffffffff < hash_length) {
    return -0x87;
  }
  if (((alg & 0xffffff00) == 0x10020000) && (alg != 0x10020000)) {
    if (md_info_00 == (mbedtls_md_info_t *)0x0) {
      return -0x86;
    }
    bVar1 = mbedtls_md_get_size(md_info_00);
    if (bVar1 != hash_length) {
      return -0x87;
    }
  }
  if (((alg & 0xffffff00) == 0x10030000) && (md_info_00 == (mbedtls_md_info_t *)0x0)) {
    hash_length_local._4_4_ = -0x86;
  }
  else {
    hash_length_local._4_4_ = 0;
  }
  return hash_length_local._4_4_;
}

Assistant:

static psa_status_t psa_rsa_decode_md_type( psa_algorithm_t alg,
                                            size_t hash_length,
                                            mbedtls_md_type_t *md_alg )
{
    psa_algorithm_t hash_alg = PSA_ALG_SIGN_GET_HASH( alg );
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
    *md_alg = mbedtls_md_get_type( md_info );

    /* The Mbed TLS RSA module uses an unsigned int for hash length
     * parameters. Validate that it fits so that we don't risk an
     * overflow later. */
#if SIZE_MAX > UINT_MAX
    if( hash_length > UINT_MAX )
        return( PSA_ERROR_INVALID_ARGUMENT );
#endif

#if defined(MBEDTLS_PKCS1_V15)
    /* For PKCS#1 v1.5 signature, if using a hash, the hash length
     * must be correct. */
    if( PSA_ALG_IS_RSA_PKCS1V15_SIGN( alg ) &&
        alg != PSA_ALG_RSA_PKCS1V15_SIGN_RAW )
    {
        if( md_info == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        if( mbedtls_md_get_size( md_info ) != hash_length )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
#endif /* MBEDTLS_PKCS1_V15 */

#if defined(MBEDTLS_PKCS1_V21)
    /* PSS requires a hash internally. */
    if( PSA_ALG_IS_RSA_PSS( alg ) )
    {
        if( md_info == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
    }
#endif /* MBEDTLS_PKCS1_V21 */

    return( PSA_SUCCESS );
}